

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O3

float If_CutDelaySpecial(If_Man_t *p,If_Cut_t *pCut,int fCarry)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  uVar1 = *(uint *)&pCut->field_0x1c;
  if (0x3ffffff < uVar1) {
    __assert_fail("pCut->nLeaves <= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                  ,0x7a,"float If_CutDelaySpecial(If_Man_t *, If_Cut_t *, int)");
  }
  if (uVar1 < 0x1000000) {
    fVar4 = -1e+20;
  }
  else {
    fVar4 = -1e+20;
    uVar3 = 0;
    do {
      fVar5 = (&pCut[1].Area)[uVar3];
      if (((long)(int)fVar5 < 0) || (p->vObjs->nSize <= (int)fVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = p->vObjs->pArray[(int)fVar5];
      if (pvVar2 == (void *)0x0) {
        return fVar4;
      }
      fVar5 = *(float *)((long)pvVar2 + 0x5c) + If_CutDelaySpecial::Pin2Pin[fCarry][uVar3];
      if (fVar4 <= fVar5) {
        fVar4 = fVar5;
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 >> 0x18 != uVar3);
  }
  return fVar4;
}

Assistant:

float If_CutDelaySpecial( If_Man_t * p, If_Cut_t * pCut, int fCarry )
{
    static float Pin2Pin[2][3] = { {1.0, 1.0, 1.0}, {1.0, 1.0, 0.0} };
    If_Obj_t * pLeaf;
    float DelayCur, Delay = -IF_FLOAT_LARGE;
    int i;
    assert( pCut->nLeaves <= 3 );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        DelayCur = If_ObjCutBest(pLeaf)->Delay;
        Delay = IF_MAX( Delay, Pin2Pin[fCarry][i] + DelayCur );
    }
    return Delay;
}